

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS ref_node_eliminate_unused_globals(REF_NODE ref_node)

{
  REF_MPI ref_mpi;
  REF_GLOB *pRVar1;
  REF_INT *pRVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  int iVar5;
  int iVar6;
  uint n;
  void *array;
  REF_INT *counts;
  ulong uVar7;
  long lVar8;
  REF_GLOB *pRVar9;
  ulong uVar10;
  undefined8 uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  char *pcVar16;
  long lVar17;
  size_t __size;
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar24;
  long lVar21;
  
  ref_mpi = ref_node->ref_mpi;
  uVar4 = ref_sort_in_place_glob(ref_node->n_unused,ref_node->unused_global);
  if (uVar4 != 0) {
    pcVar16 = "in place";
    uVar11 = 0x27c;
LAB_0017cb75:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar11,
           "ref_node_eliminate_unused_globals",(ulong)uVar4,pcVar16);
    return uVar4;
  }
  if ((long)ref_mpi->n < 0) {
    pcVar16 = "malloc counts of REF_INT negative";
    uVar11 = 0x27f;
LAB_0017cc2f:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar11,
           "ref_node_eliminate_unused_globals",pcVar16);
    return 1;
  }
  __size = (long)ref_mpi->n << 2;
  array = malloc(__size);
  if (array == (void *)0x0) {
    pcVar16 = "malloc counts of REF_INT NULL";
    uVar11 = 0x27f;
LAB_0017cc85:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar11,
           "ref_node_eliminate_unused_globals",pcVar16);
    return 2;
  }
  counts = (REF_INT *)malloc(__size);
  if (counts == (REF_INT *)0x0) {
    pcVar16 = "malloc active_counts of REF_INT NULL";
    uVar11 = 0x280;
    goto LAB_0017cc85;
  }
  uVar4 = ref_mpi_allgather(ref_mpi,&ref_node->n_unused,array,1);
  if (uVar4 != 0) {
    pcVar16 = "gather size";
    uVar11 = 0x283;
    goto LAB_0017cb75;
  }
  uVar10 = (ulong)ref_mpi->n;
  if ((long)uVar10 < 1) {
    lVar17 = 0;
  }
  else {
    uVar7 = 0;
    lVar17 = 0;
    do {
      lVar17 = lVar17 + *(int *)((long)array + uVar7 * 4);
      uVar7 = uVar7 + 1;
    } while (uVar10 != uVar7);
    iVar5 = (int)(lVar17 / (long)uVar10) + 1;
    iVar14 = 100000;
    if (100000 < iVar5) {
      iVar14 = iVar5;
    }
    if (0 < ref_mpi->n) {
      uVar7 = 0;
      do {
        auVar3 = _DAT_00212c50;
        uVar15 = (uint)uVar7;
        lVar18 = (long)(int)uVar15;
        uVar7 = (ulong)(uVar15 + 1);
        iVar5 = (int)uVar10;
        if ((int)(uVar15 + 1) < iVar5) {
          iVar6 = *(int *)((long)array + lVar18 * 4);
          uVar7 = lVar18 + 1;
          do {
            iVar6 = iVar6 + *(int *)((long)array + uVar7 * 4);
            if (iVar14 < iVar6) goto LAB_0017cd2f;
            uVar7 = uVar7 + 1;
          } while ((long)iVar5 != uVar7);
          uVar7 = uVar10 & 0xffffffff;
        }
LAB_0017cd2f:
        if (0 < iVar5) {
          lVar8 = (uVar10 & 0xffffffff) - 1;
          auVar19._8_4_ = (int)lVar8;
          auVar19._0_8_ = lVar8;
          auVar19._12_4_ = (int)((ulong)lVar8 >> 0x20);
          auVar19 = auVar19 ^ _DAT_00212c50;
          lVar8 = 0;
          auVar20 = _DAT_00212c40;
          auVar22 = _DAT_00212c30;
          do {
            auVar23 = auVar20 ^ auVar3;
            iVar6 = auVar19._4_4_;
            if ((bool)(~(auVar23._4_4_ == iVar6 && auVar19._0_4_ < auVar23._0_4_ ||
                        iVar6 < auVar23._4_4_) & 1)) {
              *(undefined4 *)((long)counts + lVar8) = 0;
            }
            if ((auVar23._12_4_ != auVar19._12_4_ || auVar23._8_4_ <= auVar19._8_4_) &&
                auVar23._12_4_ <= auVar19._12_4_) {
              *(undefined4 *)((long)counts + lVar8 + 4) = 0;
            }
            auVar23 = auVar22 ^ auVar3;
            iVar24 = auVar23._4_4_;
            if (iVar24 <= iVar6 && (iVar24 != iVar6 || auVar23._0_4_ <= auVar19._0_4_)) {
              *(undefined4 *)((long)counts + lVar8 + 8) = 0;
              *(undefined4 *)((long)counts + lVar8 + 0xc) = 0;
            }
            lVar21 = auVar20._8_8_;
            auVar20._0_8_ = auVar20._0_8_ + 4;
            auVar20._8_8_ = lVar21 + 4;
            lVar21 = auVar22._8_8_;
            auVar22._0_8_ = auVar22._0_8_ + 4;
            auVar22._8_8_ = lVar21 + 4;
            lVar8 = lVar8 + 0x10;
          } while ((ulong)(iVar5 + 3U >> 2) << 4 != lVar8);
        }
        n = 0;
        iVar5 = (int)uVar7;
        if ((int)uVar15 < iVar5) {
          memcpy(counts + lVar18,(void *)((long)array + lVar18 * 4),(ulong)(~uVar15 + iVar5) * 4 + 4
                );
          n = 0;
          do {
            n = n + counts[lVar18];
            lVar18 = lVar18 + 1;
          } while (iVar5 != lVar18);
          if ((int)n < 0) {
            pcVar16 = "malloc unused of REF_GLOB negative";
            uVar11 = 0x2a0;
            goto LAB_0017cc2f;
          }
        }
        uVar10 = (ulong)n;
        pRVar9 = (REF_GLOB *)malloc(uVar10 * 8);
        if (pRVar9 == (REF_GLOB *)0x0) {
          pcVar16 = "malloc unused of REF_GLOB NULL";
          uVar11 = 0x2a0;
          goto LAB_0017cc85;
        }
        uVar4 = ref_mpi_allgatherv(ref_mpi,ref_node->unused_global,counts,pRVar9,2);
        if (uVar4 != 0) {
          pcVar16 = "gather active unused";
          uVar11 = 0x2a3;
          goto LAB_0017cb75;
        }
        uVar4 = ref_sort_in_place_glob(n,pRVar9);
        if (uVar4 != 0) {
          pcVar16 = "in place sort";
          uVar11 = 0x2a5;
          goto LAB_0017cb75;
        }
        if (ref_mpi->id < iVar5 && (int)uVar15 <= ref_mpi->id) {
          ref_node->n_unused = 0;
        }
        uVar4 = ref_node->n;
        if (0 < (long)(int)uVar4) {
          pRVar1 = ref_node->sorted_global;
          lVar18 = 0;
          uVar12 = 0;
          do {
            lVar8 = pRVar1[lVar18];
            if ((int)uVar12 < (int)n) {
              uVar13 = (ulong)(int)uVar12;
              do {
                uVar12 = uVar13;
                if (lVar8 <= pRVar9[uVar13]) break;
                uVar13 = uVar13 + 1;
                uVar12 = uVar10;
              } while (uVar10 != uVar13);
            }
            pRVar1[lVar18] = lVar8 - (int)uVar12;
            lVar18 = lVar18 + 1;
          } while (lVar18 != (int)uVar4);
        }
        iVar6 = ref_node->n_unused;
        if (0 < (long)iVar6) {
          pRVar1 = ref_node->unused_global;
          lVar18 = 0;
          uVar12 = 0;
          do {
            lVar8 = pRVar1[lVar18];
            if ((int)uVar12 < (int)n) {
              uVar13 = (ulong)(int)uVar12;
              do {
                uVar12 = uVar13;
                if (lVar8 <= pRVar9[uVar13]) break;
                uVar13 = uVar13 + 1;
                uVar12 = uVar10;
              } while (uVar10 != uVar13);
            }
            pRVar1[lVar18] = lVar8 - (int)uVar12;
            lVar18 = lVar18 + 1;
          } while (lVar18 != iVar6);
        }
        free(pRVar9);
        uVar10 = (ulong)(uint)ref_mpi->n;
        uVar7 = uVar7 & 0xffffffff;
      } while (iVar5 < ref_mpi->n);
      goto LAB_0017cfaa;
    }
  }
  uVar4 = ref_node->n;
LAB_0017cfaa:
  if (0 < (int)uVar4) {
    pRVar2 = ref_node->sorted_local;
    pRVar9 = ref_node->global;
    pRVar1 = ref_node->sorted_global;
    uVar10 = 0;
    do {
      pRVar9[pRVar2[uVar10]] = pRVar1[uVar10];
      uVar10 = uVar10 + 1;
    } while (uVar4 != uVar10);
  }
  lVar17 = ref_node->old_n_global - lVar17;
  ref_node->old_n_global = lVar17;
  ref_node->new_n_global = lVar17;
  free(counts);
  free(array);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_node_eliminate_unused_globals(REF_NODE ref_node) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT *counts, *active_counts;
  REF_GLOB *unused;
  REF_GLOB total_unused;
  REF_INT total_active;
  REF_INT part, chunk;
  REF_INT active0, active1, nactive;
  REF_INT i, local;

  /* sort so that decrement of future processed unused works */
  RSS(ref_sort_in_place_glob(ref_node_n_unused(ref_node),
                             ref_node->unused_global),
      "in place");

  /* share unused count */
  ref_malloc(counts, ref_mpi_n(ref_mpi), REF_INT);
  ref_malloc(active_counts, ref_mpi_n(ref_mpi), REF_INT);
  RSS(ref_mpi_allgather(ref_mpi, &(ref_node_n_unused(ref_node)), counts,
                        REF_INT_TYPE),
      "gather size");
  total_unused = 0;
  each_ref_mpi_part(ref_mpi, part) total_unused += counts[part];

  /* heuristic of max to process at a time */
  chunk = (REF_INT)(total_unused / ref_mpi_n(ref_mpi) + 1);
  chunk = MAX(chunk, 100000);

  /* while have unused to process */
  active0 = 0;
  while (active0 < ref_mpi_n(ref_mpi)) {
    /* processor [active0, active1) slice of at least one and less than chunk */
    RSS(ref_node_eliminate_active_parts(ref_mpi_n(ref_mpi), counts, chunk,
                                        active0, &active1, &nactive),
        "active part range");

    /* active unused count and share active unused list, sorted */
    each_ref_mpi_part(ref_mpi, part) active_counts[part] = 0;
    for (part = active0; part < active1; part++) {
      active_counts[part] = counts[part];
    }

    /* count active unused (between active0 and active1-1) */
    total_active = 0;
    for (part = active0; part < active1; part++) {
      total_active += active_counts[part];
    }

    /* gather active unused, and sort */
    ref_malloc(unused, total_active, REF_GLOB);
    RSS(ref_mpi_allgatherv(ref_mpi, ref_node->unused_global, active_counts,
                           unused, REF_GLOB_TYPE),
        "gather active unused");
    /* (each part already sorted, merge sort faster? */
    RSS(ref_sort_in_place_glob(total_active, unused), "in place sort");

    /* erase unused gathered in active unused list */
    if (active0 <= ref_mpi_rank(ref_mpi) && ref_mpi_rank(ref_mpi) < active1)
      ref_node_n_unused(ref_node) = 0;

    /* shift ref_node sorted_globals */
    RSS(ref_node_eliminate_unused_offset(ref_node_n(ref_node),
                                         ref_node->sorted_global, total_active,
                                         unused),
        "offset sorted globals");

    /* shift unprocessed unused */
    RSS(ref_node_eliminate_unused_offset(ref_node_n_unused(ref_node),
                                         ref_node->unused_global, total_active,
                                         unused),
        "offset sorted unused");
    ref_free(unused);

    active0 = active1;
  }

  /* update node global with shifted sorted_global */
  for (i = 0; i < ref_node_n(ref_node); i++) {
    local = ref_node->sorted_local[i];
    ref_node->global[local] = ref_node->sorted_global[i];
  }

  /* set compact global count */
  RSS(ref_node_initialize_n_global(ref_node,
                                   ref_node->old_n_global - total_unused),
      "re-init");

  ref_free(active_counts);
  ref_free(counts);
  return REF_SUCCESS;
}